

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O3

void __thiscall cmDocumentationSection::Append(cmDocumentationSection *this,char *n,char *b)

{
  cmDocumentationEntry local_50;
  
  cmDocumentationEntry::cmDocumentationEntry(&local_50,n,b);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
  emplace_back<cmDocumentationEntry>(&this->Entries,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.Brief._M_dataplus._M_p != &local_50.Brief.field_2) {
    operator_delete(local_50.Brief._M_dataplus._M_p,local_50.Brief.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.Name._M_dataplus._M_p != &local_50.Name.field_2) {
    operator_delete(local_50.Name._M_dataplus._M_p,local_50.Name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmDocumentationSection::Append(const char *n, const char *b)
{
  this->Entries.push_back(cmDocumentationEntry(n,b));
}